

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFAcceleratorTable.cpp
# Opt level: O0

void __thiscall llvm::AppleAcceleratorTable::Header::dump(Header *this,ScopedPrinter *W)

{
  DictScope DVar1;
  StringRef local_a0;
  StringRef local_90;
  StringRef local_80;
  StringRef local_70;
  StringRef local_60 [2];
  StringRef local_40;
  StringRef local_30;
  DelimitedScope<___,____> local_20;
  DictScope HeaderScope;
  ScopedPrinter *W_local;
  Header *this_local;
  
  HeaderScope.W = W;
  StringRef::StringRef(&local_30,"Header");
  DelimitedScope<'{',_'}'>::DelimitedScope(&local_20,W,local_30);
  DVar1 = HeaderScope;
  StringRef::StringRef(&local_40,"Magic");
  ScopedPrinter::printHex<unsigned_int>(DVar1.W,local_40,this->Magic);
  DVar1 = HeaderScope;
  StringRef::StringRef(local_60,"Version");
  ScopedPrinter::printHex<unsigned_short>(DVar1.W,local_60[0],this->Version);
  DVar1 = HeaderScope;
  StringRef::StringRef(&local_70,"Hash function");
  ScopedPrinter::printHex<unsigned_short>(DVar1.W,local_70,this->HashFunction);
  DVar1 = HeaderScope;
  StringRef::StringRef(&local_80,"Bucket count");
  ScopedPrinter::printNumber(DVar1.W,local_80,this->BucketCount);
  DVar1 = HeaderScope;
  StringRef::StringRef(&local_90,"Hashes count");
  ScopedPrinter::printNumber(DVar1.W,local_90,this->HashCount);
  DVar1 = HeaderScope;
  StringRef::StringRef(&local_a0,"HeaderData length");
  ScopedPrinter::printNumber(DVar1.W,local_a0,this->HeaderDataLength);
  DelimitedScope<'{',_'}'>::~DelimitedScope(&local_20);
  return;
}

Assistant:

void AppleAcceleratorTable::Header::dump(ScopedPrinter &W) const {
  DictScope HeaderScope(W, "Header");
  W.printHex("Magic", Magic);
  W.printHex("Version", Version);
  W.printHex("Hash function", HashFunction);
  W.printNumber("Bucket count", BucketCount);
  W.printNumber("Hashes count", HashCount);
  W.printNumber("HeaderData length", HeaderDataLength);
}